

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O3

Utest * __thiscall
TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_TestShell::createTest
          (TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_TestShell *this)

{
  TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test *this_00;
  
  this_00 = (TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
                         ,0x2d4);
  TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test::
  TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(UnitTestMacros, FailureWithSIGNED_BYTES_EQUAL)
{
    fixture.runTestWithMethod(failingTestMethodWithSIGNED_BYTES_EQUAL_);
#if CPPUTEST_CHAR_BIT == 16
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xffff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfffe)>");
#elif CPPUTEST_CHAR_BIT == 8
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfe)>");
#endif
}